

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSM::output(FSM *this,shared_ptr<kratos::Var> *var)

{
  shared_ptr<kratos::Var> local_28;
  shared_ptr<kratos::Var> *local_18;
  shared_ptr<kratos::Var> *var_local;
  FSM *this_local;
  
  local_18 = var;
  var_local = (shared_ptr<kratos::Var> *)this;
  std::shared_ptr<kratos::Var>::shared_ptr(&local_28,(nullptr_t)0x0);
  output(this,var,&local_28);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_28);
  return;
}

Assistant:

void FSM::output(const std::shared_ptr<Var>& var) { output(var, nullptr); }